

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

BcOp binop_opcode(Tk binop)

{
  if (binop < 0x3e) {
    switch(binop) {
    case 0x2a:
      return BC_MUL_LL;
    case 0x2b:
      return BC_ADD_LL;
    case 0x2c:
    case 0x2e:
      break;
    case 0x2d:
      return BC_SUB_LL;
    case 0x2f:
      return BC_DIV_LL;
    default:
      if (binop == 0x3c) {
        return BC_LT_LL;
      }
    }
  }
  else {
    switch(binop) {
    case 0x106:
      return BC_EQ_LL;
    case 0x107:
      return BC_NEQ_LL;
    case 0x108:
      return BC_LE_LL;
    case 0x109:
      return BC_GE_LL;
    }
    if (binop == 0x3e) {
      return BC_GT_LL;
    }
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                ,0x176,"BcOp binop_opcode(Tk)");
}

Assistant:

static BcOp binop_opcode(Tk binop) {
	switch (binop) {
		// Arithmetic operators
		case '+': return BC_ADD_LL;
		case '-': return BC_SUB_LL;
		case '*': return BC_MUL_LL;
		case '/': return BC_DIV_LL;

		// Relational operators
		case TK_EQ:  return BC_EQ_LL;
		case TK_NEQ: return BC_NEQ_LL;
		case '>':    return BC_GT_LL;
		case TK_GE:  return BC_GE_LL;
		case '<':    return BC_LT_LL;
		case TK_LE:  return BC_LE_LL;

		default: UNREACHABLE();
	}
}